

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec.c
# Opt level: O1

char decLuhnCalc(char *dec)

{
  undefined1 auVar1 [16];
  long lVar2;
  size_t sVar3;
  byte bVar4;
  ulong uVar5;
  
  sVar3 = strLen(dec);
  if (sVar3 == 0) {
    bVar4 = 0x30;
  }
  else {
    uVar5 = 0;
    do {
      uVar5 = uVar5 + *(long *)("pfokTest: %s\n" + (long)dec[sVar3 - 1] * 8 + 7);
      if (sVar3 == 1) {
        sVar3 = 0;
      }
      else {
        lVar2 = sVar3 - 2;
        sVar3 = sVar3 - 2;
        uVar5 = (uVar5 + (long)dec[lVar2]) - 0x30;
      }
    } while (sVar3 != 0);
    uVar5 = (uVar5 + (uVar5 / 5 & 0xfffffffffffffffe) * -5) * 9;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar5;
    bVar4 = (char)uVar5 + SUB161(auVar1 * ZEXT816(0x199999999999999a),8) * -10 | 0x30;
  }
  return bVar4;
}

Assistant:

char decLuhnCalc(const char* dec)
{
	register word cd = 0;
	size_t i;
	ASSERT(decIsValid(dec));
	for (i = strLen(dec); i--;) 
	{
		cd += luhn_table[dec[i] - '0'];
		if (i)
			cd += dec[--i] - '0';
	}
	cd %= 10, cd = ((cd << 3) + cd) % 10;
	return (char)cd + '0';
}